

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O2

void * __thiscall embree::BVHN<4>::Allocator::operator()(Allocator *this,size_t bytes)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  FastAllocator *this_00;
  BVHN<4> *pBVar3;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> this_01;
  MutexSys *pMVar4;
  MutexSys MVar5;
  long *plVar6;
  ThreadLocal2 *this_02;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  Lock<embree::MutexSys> lock;
  Lock<embree::MutexSys> local_40;
  MutexSys local_30;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  local_28;
  
  plVar6 = (long *)__tls_get_addr(&PTR_021f8d38);
  this_02 = (ThreadLocal2 *)*plVar6;
  if (this_02 == (ThreadLocal2 *)0x0) {
    this_02 = (ThreadLocal2 *)FastAllocator::ThreadLocal2::operator_new(0xc0);
    MutexSys::MutexSys((MutexSys *)this_02);
    (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_02->alloc0).parent = this_02;
    (this_02->alloc0).ptr = (char *)0x0;
    (this_02->alloc0).cur = 0;
    (this_02->alloc0).end = 0;
    (this_02->alloc0).allocBlockSize = 0;
    (this_02->alloc0).bytesUsed = 0;
    (this_02->alloc0).bytesWasted = 0;
    (this_02->alloc1).parent = this_02;
    (this_02->alloc1).ptr = (char *)0x0;
    (this_02->alloc1).cur = 0;
    (this_02->alloc1).end = 0;
    (this_02->alloc1).allocBlockSize = 0;
    (this_02->alloc1).bytesUsed = 0;
    (this_02->alloc1).bytesWasted = 0;
    *plVar6 = (long)this_02;
    lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    lock.locked = true;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_40.mutex = (MutexSys *)this_02;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_40);
    std::
    unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   *)&local_40);
    Lock<embree::MutexSys>::~Lock(&lock);
  }
  pBVar3 = this->bvh;
  this_00 = &pBVar3->alloc;
  this_01._M_head_impl = (this_02->alloc0).parent;
  local_30.mutex = (void *)bytes;
  if (this_00 != ((this_01._M_head_impl)->alloc)._M_b._M_p) {
    local_40.locked = true;
    local_40.mutex = &(this_01._M_head_impl)->mutex;
    MutexSys::lock(&(this_01._M_head_impl)->mutex);
    if (((this_01._M_head_impl)->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           ((this_01._M_head_impl)->alloc1).bytesUsed + ((this_01._M_head_impl)->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           ((((this_01._M_head_impl)->alloc0).end + ((this_01._M_head_impl)->alloc1).end) -
           (((this_01._M_head_impl)->alloc0).cur + ((this_01._M_head_impl)->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           ((this_01._M_head_impl)->alloc1).bytesWasted +
           ((this_01._M_head_impl)->alloc0).bytesWasted;
      UNLOCK();
    }
    ((this_01._M_head_impl)->alloc0).bytesUsed = 0;
    ((this_01._M_head_impl)->alloc0).bytesWasted = 0;
    ((this_01._M_head_impl)->alloc0).end = 0;
    ((this_01._M_head_impl)->alloc0).allocBlockSize = 0;
    ((this_01._M_head_impl)->alloc0).ptr = (char *)0x0;
    ((this_01._M_head_impl)->alloc0).cur = 0;
    ((this_01._M_head_impl)->alloc0).allocBlockSize = (pBVar3->alloc).defaultBlockSize;
    ((this_01._M_head_impl)->alloc1).ptr = (char *)0x0;
    ((this_01._M_head_impl)->alloc1).cur = 0;
    ((this_01._M_head_impl)->alloc1).end = 0;
    ((this_01._M_head_impl)->alloc1).allocBlockSize = 0;
    ((this_01._M_head_impl)->alloc1).bytesUsed = 0;
    ((this_01._M_head_impl)->alloc1).bytesWasted = 0;
    ((this_01._M_head_impl)->alloc1).allocBlockSize = (pBVar3->alloc).defaultBlockSize;
    LOCK();
    ((this_01._M_head_impl)->alloc)._M_b._M_p = this_00;
    UNLOCK();
    lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    lock.locked = true;
    local_28._M_t.
    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
         (tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
          )(tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            )this_01._M_head_impl;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(pBVar3->alloc).thread_local_allocators,(value_type *)&local_28);
    Lock<embree::MutexSys>::~Lock(&lock);
    Lock<embree::MutexSys>::~Lock(&local_40);
  }
  MVar5.mutex = local_30.mutex;
  psVar1 = &(this_02->alloc0).bytesUsed;
  *psVar1 = (long)local_30.mutex + *psVar1;
  sVar9 = (this_02->alloc0).cur;
  uVar10 = (ulong)(-(int)sVar9 & 0xf);
  uVar7 = (long)local_30.mutex + uVar10 + sVar9;
  (this_02->alloc0).cur = uVar7;
  if ((this_02->alloc0).end < uVar7) {
    (this_02->alloc0).cur = sVar9;
    pMVar4 = (MutexSys *)(this_02->alloc0).allocBlockSize;
    if ((MutexSys *)((long)local_30.mutex * 4) < pMVar4 ||
        (long)local_30.mutex * 4 - (long)pMVar4 == 0) {
      lock.mutex = pMVar4;
      pcVar8 = (char *)FastAllocator::malloc(this_00,(size_t)&lock);
      (this_02->alloc0).ptr = pcVar8;
      sVar9 = ((this_02->alloc0).end - (this_02->alloc0).cur) + (this_02->alloc0).bytesWasted;
      (this_02->alloc0).bytesWasted = sVar9;
      (this_02->alloc0).end = (size_t)lock.mutex;
      (this_02->alloc0).cur = (size_t)MVar5.mutex;
      if (lock.mutex < MVar5.mutex) {
        (this_02->alloc0).cur = 0;
        lock.mutex = (MutexSys *)(this_02->alloc0).allocBlockSize;
        pcVar8 = (char *)FastAllocator::malloc(this_00,(size_t)&lock);
        (this_02->alloc0).ptr = pcVar8;
        sVar9 = ((this_02->alloc0).end - (this_02->alloc0).cur) + (this_02->alloc0).bytesWasted;
        (this_02->alloc0).bytesWasted = sVar9;
        (this_02->alloc0).end = (size_t)lock.mutex;
        (this_02->alloc0).cur = (size_t)MVar5.mutex;
        if (lock.mutex < MVar5.mutex) {
          (this_02->alloc0).cur = 0;
          return (void *)0x0;
        }
      }
      (this_02->alloc0).bytesWasted = sVar9;
    }
    else {
      pcVar8 = (char *)FastAllocator::malloc(this_00,(size_t)&local_30);
    }
  }
  else {
    psVar1 = &(this_02->alloc0).bytesWasted;
    *psVar1 = *psVar1 + uVar10;
    pcVar8 = (this_02->alloc0).ptr + (uVar7 - (long)local_30.mutex);
  }
  return pcVar8;
}

Assistant:

__forceinline void* operator() (size_t bytes) const { 
        return bvh->alloc._threadLocal()->malloc(&bvh->alloc,bytes); 
      }